

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseTrue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar2;
  
  pcVar1 = is->src_;
  if (*pcVar1 == 't') {
    is->src_ = pcVar1 + 1;
    if (((pcVar1[1] == 'r') && (is->src_ = pcVar1 + 2, pcVar1[2] == 'u')) &&
       (is->src_ = pcVar1 + 3, pcVar1[3] == 'e')) {
      is->src_ = pcVar1 + 4;
      pGVar2 = internal::Stack<rapidjson::CrtAllocator>::
               Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         (&handler->stack_,1);
      (pGVar2->data_).n = (Number)0x0;
      (pGVar2->data_).s.str = (Ch *)0x0;
      (pGVar2->data_).f.flags = 10;
    }
    else {
      ParseTrue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                ();
    }
    return;
  }
  __assert_fail("is.Peek() == \'t\'",
                "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                ,0x364,
                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
               );
}

Assistant:

void ParseTrue(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 't');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'r') && Consume(is, 'u') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(true)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }